

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIPSolution.cpp
# Opt level: O2

void __thiscall BGIPSolution::SetNrDesiredSolutions(BGIPSolution *this,size_t n)

{
  FixedCapacityPriorityQueue<boost::shared_ptr<JPPVValuePair>,_std::less<boost::shared_ptr<JPPVValuePair>_>_>
  local_30;
  
  this->_m_nrDesiredSolutions = n;
  if (n == 0x7fffffff) {
    this->_m_useFixedCapacityPriorityQueue = false;
  }
  else {
    this->_m_useFixedCapacityPriorityQueue = true;
    local_30._m_l.
    super__List_base<boost::shared_ptr<JPPVValuePair>,_std::allocator<boost::shared_ptr<JPPVValuePair>_>_>
    ._M_impl._M_node._M_size = 0;
    local_30._m_l.
    super__List_base<boost::shared_ptr<JPPVValuePair>,_std::allocator<boost::shared_ptr<JPPVValuePair>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_30;
    local_30._m_l.
    super__List_base<boost::shared_ptr<JPPVValuePair>,_std::allocator<boost::shared_ptr<JPPVValuePair>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_30;
    local_30._m_capacity = n;
    FixedCapacityPriorityQueue<boost::shared_ptr<JPPVValuePair>,_std::less<boost::shared_ptr<JPPVValuePair>_>_>
    ::operator=(&this->_m_qFixedK,&local_30);
    std::__cxx11::
    _List_base<boost::shared_ptr<JPPVValuePair>,_std::allocator<boost::shared_ptr<JPPVValuePair>_>_>
    ::_M_clear((_List_base<boost::shared_ptr<JPPVValuePair>,_std::allocator<boost::shared_ptr<JPPVValuePair>_>_>
                *)&local_30);
    local_30._m_capacity = this->_m_nrDesiredSolutions;
    local_30._m_l.
    super__List_base<boost::shared_ptr<JPPVValuePair>,_std::allocator<boost::shared_ptr<JPPVValuePair>_>_>
    ._M_impl._M_node._M_size = 0;
    local_30._m_l.
    super__List_base<boost::shared_ptr<JPPVValuePair>,_std::allocator<boost::shared_ptr<JPPVValuePair>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_30;
    local_30._m_l.
    super__List_base<boost::shared_ptr<JPPVValuePair>,_std::allocator<boost::shared_ptr<JPPVValuePair>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_30;
    FixedCapacityPriorityQueue<boost::shared_ptr<PartialJPDPValuePair>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
    ::operator=(&this->_m_qpFixedK,
                (FixedCapacityPriorityQueue<boost::shared_ptr<PartialJPDPValuePair>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
                 *)&local_30);
    std::__cxx11::
    _List_base<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
    ::_M_clear((_List_base<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
                *)&local_30);
  }
  return;
}

Assistant:

void BGIPSolution::SetNrDesiredSolutions(size_t n) 
{
    _m_nrDesiredSolutions =  n;
    if(_m_nrDesiredSolutions==INT_MAX)
        _m_useFixedCapacityPriorityQueue=false;
    else
        _m_useFixedCapacityPriorityQueue=true;

    if(_m_useFixedCapacityPriorityQueue)
    {
        _m_qFixedK=FixedCapacityPriorityQueue<boost::shared_ptr<JPPVValuePair> >(_m_nrDesiredSolutions);
        _m_qpFixedK=FixedCapacityPriorityQueue<boost::shared_ptr<PartialJPDPValuePair> >(_m_nrDesiredSolutions);
    }
}